

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
r_code::list<unsigned_short>::push_back(list<unsigned_short> *this,unsigned_short *t)

{
  long lVar1;
  pointer pcVar2;
  
  if (this->free_cell_count == 0) {
    push_back_new_cell(this,t);
    pcVar2 = (this->cells).
             super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = this->used_cells_tail;
  }
  else {
    pcVar2 = (this->cells).
             super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = this->free_cells;
    this->free_cells = pcVar2[lVar1].next;
    this->free_cell_count = this->free_cell_count - 1;
    pcVar2[lVar1].data = *t;
    pcVar2[lVar1].next = -1;
    pcVar2[lVar1].prev = this->used_cells_tail;
    this->used_cells_tail = lVar1;
  }
  if (pcVar2[lVar1].prev != -1) {
    pcVar2[pcVar2[lVar1].prev].next = lVar1;
  }
  if (this->used_cells_head == -1) {
    this->used_cells_head = lVar1;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_back(const T &t)
    {
        if (free_cell_count) {
            push_back_free_cell(t);
        } else {
            push_back_new_cell(t);
        }

        update_used_cells_tail_state();
    }